

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O0

void process_args(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1a1;
  string local_1a0;
  int local_180;
  undefined4 local_17c;
  int c;
  int option_index;
  option long_options [11];
  char **argv_local;
  int argc_local;
  
  long_options[10]._24_8_ = argv;
  memcpy(&c,&PTR_anon_var_dwarf_8ed3_001ed3a0,0x160);
  poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar2 = std::operator<<(poVar2,*(char **)long_options[10]._24_8_);
  poVar2 = std::operator<<(poVar2," [arguments]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"valid arguments:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-a --inputdirfg sets the input directory for foreground frames");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-b --inputdirbg sets the input directory for background frames");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-o --outputdir sets the directory for output frames");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-s --shader sets the filename of the fragment shader");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-f --filetype sets the filetype (only tested with png so far)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-n --numframes sets the number of frames to store in memory at once");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\t(defaults to 8)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-d --delay sets the delay for processed_older frame, only affects some filters"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\t(defaults to 1)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-w --width sets the frame width in pixels");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-h --height sets the frame height in pixels");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"\t(defaults to 1280x720)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-c --swap swaps the foreground/background inputs to the shader");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-p --preview run in preview mode, don\'t save images just play the effect"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_17c = 0;
  do {
    local_180 = getopt_long(argc,long_options[10]._24_8_,"a:b:o:s:f:n:d:w:h:cp",&c,&local_17c);
    pcVar3 = _optarg;
    if (local_180 == -1) {
      return;
    }
    switch(local_180) {
    case 0:
      poVar2 = std::operator<<((ostream *)&std::cout,"idk what this means, something\'s funny with "
                              );
      poVar2 = std::operator<<(poVar2," ur args");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      break;
    default:
      abort();
    case 0x3f:
      break;
    case 0x61:
      std::__cxx11::string::operator=((string *)&input_dir_fg_abi_cxx11_,_optarg);
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[](0x1f1320);
      if (*pcVar3 != '/') {
        poVar2 = std::operator<<((ostream *)&std::cout,"u specified a file, not a directory.");
        poVar2 = std::operator<<(poVar2," pls try again");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        abort();
      }
      break;
    case 0x62:
      std::__cxx11::string::operator=((string *)&input_dir_bg_abi_cxx11_,_optarg);
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[](0x1f1340);
      if (*pcVar3 != '/') {
        poVar2 = std::operator<<((ostream *)&std::cout,"u specified a file, not a directory. ");
        poVar2 = std::operator<<(poVar2,"pls try again");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        abort();
      }
      break;
    case 99:
      swap_fg_bg = true;
      poVar2 = std::operator<<((ostream *)&std::cout,"swapping foreground and background");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      break;
    case 100:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,pcVar3,&local_1d9);
      num_frames_back = std::__cxx11::stoi(&local_1d8,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      break;
    case 0x66:
      std::__cxx11::string::operator=((string *)&out_filetype_abi_cxx11_,_optarg);
      std::__cxx11::string::operator=((string *)&in_filetype_abi_cxx11_,_optarg);
      break;
    case 0x68:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,pcVar3,&local_229);
      iVar1 = std::__cxx11::stoi(&local_228,(size_t *)0x0,10);
      res.y = (float)iVar1;
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
      break;
    case 0x6e:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,pcVar3,&local_1a1);
      batch_size = std::__cxx11::stoi(&local_1a0,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      break;
    case 0x6f:
      std::__cxx11::string::operator=((string *)&output_dir_abi_cxx11_,_optarg);
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[](0x1f1360);
      if (*pcVar3 != '/') {
        poVar2 = std::operator<<((ostream *)&std::cout,"u specified a file, not a directory. ");
        poVar2 = std::operator<<(poVar2,"pls try again");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        abort();
      }
      break;
    case 0x70:
      preview_mode = true;
      poVar2 = std::operator<<((ostream *)&std::cout,"running in preview mode - no saving images");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      break;
    case 0x73:
      std::__cxx11::string::operator=((string *)&frag_path_abi_cxx11_,_optarg);
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[](0x1f13c0);
      if (*pcVar3 == '/') {
        poVar2 = std::operator<<((ostream *)&std::cout,"u specified a directory, ");
        poVar2 = std::operator<<(poVar2,"pls specify the frag shader filename instead");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        abort();
      }
      break;
    case 0x77:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,pcVar3,&local_201);
      iVar1 = std::__cxx11::stoi(&local_200,(size_t *)0x0,10);
      res.x = (float)iVar1;
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
    }
  } while( true );
}

Assistant:

void process_args(int argc, char* argv[]) {
	struct option long_options[] = {
		/* These options don’t set a flag.
		 We distinguish them by their indices. */
		{"inputdirfg", required_argument, 0, 'a'},
		{"inputdirbg", required_argument, 0, 'b'},
		{"outputdir", required_argument, 0, 'o'},
		{"shader", required_argument, 0, 's'},
		{"filetype", required_argument, 0, 'f'},
		{"numframes", required_argument, 0, 'n'},
		{"delay", required_argument, 0, 'd'},
		{"width", required_argument, 0, 'w'},
		{"height", required_argument, 0, 'h'},
		{"swap", no_argument, 0, 'c'},
		{"preview", no_argument, 0, 'p'}
	};

	std::cout << "Usage: " << argv[0] << " [arguments]" << std::endl;
	std::cout << "valid arguments:" << std::endl;
	std::cout << "-a --inputdirfg sets the input directory for foreground frames" << std::endl;
	std::cout << "-b --inputdirbg sets the input directory for background frames" << std::endl;
	std::cout << "-o --outputdir sets the directory for output frames" << std::endl;
	std::cout << "-s --shader sets the filename of the fragment shader" << std::endl;
	std::cout << "-f --filetype sets the filetype (only tested with png so far)" << std::endl;
	std::cout << "-n --numframes sets the number of frames to store in memory at once" << std::endl;
	std::cout << "\t(defaults to 8)" << std::endl;
	std::cout << "-d --delay sets the delay for processed_older frame, only affects some filters" << std::endl;
	std::cout << "\t(defaults to 1)" << std::endl;
	std::cout << "-w --width sets the frame width in pixels" << std::endl;
	std::cout << "-h --height sets the frame height in pixels" << std::endl;
	std::cout << "\t(defaults to 1280x720)" << std::endl;
	std::cout << "-c --swap swaps the foreground/background inputs to the shader" << std::endl;
	std::cout << "-p --preview run in preview mode, don't save images just play the effect" << std::endl;

	/* getopt_long stores the option index here. */
	int option_index = 0;
	int c;
	while (
		(c = getopt_long(
			argc,
			argv,
			"a:b:o:s:f:n:d:w:h:cp",
			long_options,
			&option_index)
		) != -1)
	{
		switch (c) {
			case 0:
				std::cout << "idk what this means, something's funny with "
					<< " ur args" << std::endl;
				break;
			case 'a':
				input_dir_fg = optarg;
				if (input_dir_fg[input_dir_fg.size()-1] != '/') {
					std::cout << "u specified a file, not a directory."
						<< " pls try again" << std::endl;
					abort();
				}
				break;
			case 'b':
				input_dir_bg = optarg;
				if (input_dir_bg[input_dir_bg.size()-1] != '/') {
					std::cout << "u specified a file, not a directory. "
						<< "pls try again" << std::endl;
					abort();
				}
				break;
			case 'o':
				output_dir = optarg;
				if (output_dir[output_dir.size()-1] != '/') {
					std::cout << "u specified a file, not a directory. "
						<< "pls try again" << std::endl;
					abort();
				}
				break;
			case 's':
				frag_path = optarg;
				if (frag_path[frag_path.size()-1] == '/') {
					std::cout << "u specified a directory, "
						<< "pls specify the frag shader filename instead"
						<< std::endl;
					abort();
				}
				break;
			case 'f':
				out_filetype = optarg;
				in_filetype = optarg;
				break;
			case 'n':
				batch_size = std::stoi(optarg);
				break;
			case 'd':
				num_frames_back = std::stoi(optarg);
				break;
			case 'w':
				res.x = std::stoi(optarg);
				break;
			case 'h':
				res.y = std::stoi(optarg);
				break;
			case 'c':
				swap_fg_bg = true;
				std::cout << "swapping foreground and background" << std::endl;
				break;
			case 'p':
				preview_mode = true;
				std::cout << "running in preview mode - no saving images"
					<< std::endl;
				break;
			case '?':
			  break;

			default:
			  abort ();
		}
	}
}